

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySortTree.c
# Opt level: O3

int InsertBST(BiTree *T,int key)

{
  BiTree pBVar1;
  BiTNode *pBVar2;
  BiTree pBVar3;
  
  pBVar1 = *T;
  if (*T == (BiTree)0x0) {
    pBVar3 = (BiTree)0x0;
  }
  else {
    do {
      pBVar3 = pBVar1;
      if (pBVar3->data == key) {
        return 0;
      }
      pBVar1 = (&pBVar3->lChild)[pBVar3->data <= key];
    } while ((&pBVar3->lChild)[pBVar3->data <= key] != (BiTNode *)0x0);
  }
  pBVar2 = (BiTNode *)malloc(0x18);
  pBVar2->data = key;
  pBVar2->lChild = (BiTNode *)0x0;
  pBVar2->rChlid = (BiTNode *)0x0;
  if (pBVar3 != (BiTree)0x0) {
    if (key < pBVar3->data) {
      T = &pBVar3->lChild;
    }
    else {
      T = &pBVar3->rChlid;
    }
  }
  *T = pBVar2;
  return 1;
}

Assistant:

int InsertBST(BiTree *T,int key){
     BiTree p,s;
     if(!SearchBST(*T,key,NULL,&p)){        //没找到key
         s = (BiTree)malloc(sizeof(BiTNode));
         s->data = key;
         s->lChild = s->rChlid = NULL;  //新结点初始化

         if(!p)
             *T = s; //插入s为新的根节点
         else if(key < p->data)
             p->lChild = s;     //插入s为左孩子
         else
             p->rChlid = s;     //插入s为右孩子
         return 1;
     } else
         return 0;
 }